

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O2

int alex::fanout_tree::find_best_fanout_existing_node<int,int>
              (AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *parent,int bucketID,
              int total_keys,
              vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              *used_fanout_tree_nodes,int max_fanout)

{
  double dVar1;
  pointer pFVar2;
  longdouble lVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *node;
  int right;
  FTNode *tree_node;
  pointer pFVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int i;
  int iVar11;
  int j;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double expected_insert_frac;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int local_210;
  int local_20c;
  double cost;
  double local_200;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_1f8;
  double local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  double local_1d8;
  double local_1d0;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  vector<double,_std::allocator<double>_> fanout_costs;
  LinearModel<int> model;
  double local_128;
  DataNodeStats stats;
  const_iterator_type it;
  FTNode local_f0;
  LinearModelBuilder<int> local_a8;
  
  local_1f8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
               *)parent->children_[bucketID];
  local_1e8 = local_1f8->num_keys_;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = 1;
  iVar9 = 1 << ((local_1f8->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  dVar1 = (parent->super_AlexNode<int,_int>).model_.a_;
  local_128 = 0.0;
  iVar10 = bucketID - bucketID % iVar9;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    auVar16._8_8_ = dVar1;
    auVar16._0_8_ = dVar1;
    auVar12 = vpinsrd_avx(ZEXT416((uint)(iVar9 + iVar10)),iVar10,1);
    auVar12 = vcvtdq2pd_avx(auVar12);
    dVar1 = (parent->super_AlexNode<int,_int>).model_.b_;
    auVar13._8_8_ = dVar1;
    auVar13._0_8_ = dVar1;
    auVar12 = vsubpd_avx512vl(auVar12,auVar13);
    auVar12 = vdivpd_avx(auVar12,auVar16);
    auVar13 = vhsubpd_avx(auVar12,auVar12);
    auVar12 = vshufpd_avx(auVar12,auVar12,1);
    auVar18._0_8_ = 1.0 / auVar13._0_8_;
    auVar18._8_8_ = 0;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar13 = vxorpd_avx512vl(auVar18,auVar4);
    local_1d8 = auVar12._0_8_ * auVar13._0_8_;
    local_128 = auVar18._0_8_;
  }
  else {
    auVar12._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = 0x8000000000000000;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (double)iVar10 - (parent->super_AlexNode<int,_int>).model_.b_;
    auVar12 = vxorpd_avx512vl(auVar15,auVar12);
    local_1d8 = auVar12._0_8_ / (double)iVar9;
  }
  local_1d0 = (double)local_1e8;
  local_210 = 0;
  local_20c = 0;
  local_200 = 1.79769313486232e+308;
  local_1e4 = total_keys;
  local_1e0 = max_fanout;
  for (; iVar8 <= local_1e0; iVar8 = iVar8 * 2) {
    new_level.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cost = 0.0;
    iVar9 = iVar8 + -1;
    new_level.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_level.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dVar14 = (double)iVar8;
    local_1f0 = dVar14 * local_128;
    dVar1 = dVar14 * local_1d8;
    local_1dc = iVar9;
    iVar10 = 0;
    for (iVar11 = 0; iVar11 != iVar8; iVar11 = iVar11 + 1) {
      if (iVar11 == iVar9) {
        right = local_1f8->data_capacity_;
      }
      else {
        local_a8.model_ = (LinearModel<int> *)(((double)(iVar11 + 1) - dVar1) / local_1f0);
        right = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                ::lower_bound<double>(local_1f8,(double *)&local_a8);
      }
      if (iVar10 == right) {
        local_a8.y_sum_._8_2_ = 0;
        local_a8._42_2_ = 0;
        local_a8._44_4_ = 0;
        local_a8.xx_sum_._0_4_ = 0;
        local_a8.xx_sum_._4_6_ = 0;
        local_a8._58_2_ = 0;
        local_a8._60_4_ = 0;
        local_a8.xy_sum_._0_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.x_sum_._8_2_ = 0;
        local_a8._26_6_ = 0;
        local_a8.y_sum_._0_4_ = 0;
        local_a8.y_sum_._4_4_ = 0;
        local_a8.model_ = (LinearModel<int> *)CONCAT44(iVar11,local_210);
        local_a8.x_sum_._0_4_ = iVar10;
        local_a8.x_sum_._4_4_ = iVar10;
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
        emplace_back<alex::fanout_tree::FTNode>(&new_level,(FTNode *)&local_a8);
      }
      else {
        model.a_ = 0.0;
        model.b_ = 0.0;
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
        Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
        ::Iterator(&it,local_1f8,iVar10);
        local_a8.model_ = &model;
        iVar9 = 0;
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
        lVar3 = (longdouble)0;
        local_a8.x_sum_._0_4_ = SUB104(lVar3,0);
        local_a8.x_sum_._4_4_ = (int)((unkuint10)lVar3 >> 0x20);
        local_a8.x_sum_._8_2_ = (undefined2)((unkuint10)lVar3 >> 0x40);
        local_a8.xx_sum_._4_6_ = (undefined6)((unkuint10)lVar3 >> 0x20);
        local_a8.x_min_ = 0x7fffffff;
        local_a8.x_max_ = -0x80000000;
        local_a8.y_min_ = 1.79769313486232e+308;
        local_a8.y_max_ = -1.79769313486232e+308;
        local_a8.y_sum_._0_4_ = local_a8.x_sum_._0_4_;
        local_a8.y_sum_._4_4_ = local_a8.x_sum_._4_4_;
        local_a8.y_sum_._8_2_ = local_a8.x_sum_._8_2_;
        local_a8.xx_sum_._0_4_ = local_a8.x_sum_._0_4_;
        local_a8.xy_sum_._0_4_ = local_a8.x_sum_._0_4_;
        local_a8.xy_sum_._4_6_ = local_a8.xx_sum_._4_6_;
        while ((it.cur_idx_ < right && (it.cur_idx_ != -1))) {
          LinearModelBuilder<int>::add(&local_a8,(it.node_)->key_slots_[it.cur_idx_],iVar9);
          AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
          Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
          ::operator++(&it,0);
          iVar9 = iVar9 + 1;
        }
        LinearModelBuilder<int>::build(&local_a8);
        node = local_1f8;
        expected_insert_frac =
             AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             frac_inserts(local_1f8);
        stats.num_search_iterations = 0.0;
        stats.num_shifts = 0.0;
        local_f0.cost =
             AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             compute_expected_cost_from_existing
                       (node,iVar10,right,0.7,expected_insert_frac,&model,&stats);
        local_f0.level = local_210;
        local_f0.use = false;
        local_f0.a = model.a_;
        local_f0.b = model.b_;
        local_f0.expected_avg_search_iterations = stats.num_search_iterations;
        local_f0.expected_avg_shifts = stats.num_shifts;
        cost = (local_f0.cost * (double)iVar9) / local_1d0 + cost;
        local_f0.node_id = iVar11;
        local_f0.left_boundary = iVar10;
        local_f0.right_boundary = right;
        local_f0.num_keys = iVar9;
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
        emplace_back<alex::fanout_tree::FTNode>(&new_level,&local_f0);
        iVar9 = local_1dc;
      }
      iVar10 = right;
    }
    cost = (dVar14 * 5e-07 * 208.0 * (double)total_keys) / local_1d0 + 20.0 + cost;
    std::vector<double,_std::allocator<double>_>::push_back(&fanout_costs,&cost);
    uVar7 = (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (((uVar7 < 0x11) ||
        (dVar1 = *(double *)
                  ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + (uVar7 - 0x10)),
        *(double *)
         ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar7 - 8)) <= dVar1)) ||
       (dVar1 <= *(double *)
                  ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + (uVar7 - 0x18)))) {
      local_1f0 = cost;
      if (cost < local_200) {
        local_20c = local_210;
      }
      std::
      vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
      ::push_back(&fanout_tree,&new_level);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_200;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_1f0;
      bVar5 = true;
      auVar12 = vminsd_avx(auVar19,auVar17);
      local_200 = auVar12._0_8_;
    }
    else {
      bVar5 = false;
    }
    std::_Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
    ~_Vector_base(&new_level.
                   super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 );
    if (!bVar5) break;
    local_210 = local_210 + 1;
  }
  pFVar2 = fanout_tree.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_20c].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar6 = fanout_tree.
                super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_20c].
                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar2; pFVar6 = pFVar6 + 1) {
    pFVar6->use = true;
  }
  merge_nodes_upwards<int,int>(local_20c,local_200,local_1e8,local_1e4,&fanout_tree);
  collect_used_nodes(&fanout_tree,local_20c,used_fanout_tree_nodes);
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::~vector(&fanout_tree);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&fanout_costs.super__Vector_base<double,_std::allocator<double>_>);
  return local_20c;
}

Assistant:

int find_best_fanout_existing_node(const AlexModelNode<T, P>* parent,
                                   int bucketID, int total_keys,
                                   std::vector<FTNode>& used_fanout_tree_nodes,
                                   int max_fanout) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  auto node = static_cast<AlexDataNode<T, P>*>(parent->children_[bucketID]);
  int num_keys = node->num_keys_;
  int best_level = 0;
  double best_cost = std::numeric_limits<double>::max();
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;

  int repeats = 1 << node->duplication_factor_;
  int start_bucketID =
      bucketID - (bucketID % repeats);  // first bucket with same child
  int end_bucketID =
      start_bucketID + repeats;  // first bucket with different child
  LinearModel<T> base_model;
  if (parent->model_.a_ == 0){
    base_model.a_ = 0;
    base_model.b_ = -1.0 * (start_bucketID - parent->model_.b_) / repeats;
  }
  else{
    double left_boundary_value =
      (start_bucketID - parent->model_.b_) / parent->model_.a_;
    double right_boundary_value =
        (end_bucketID - parent->model_.b_) / parent->model_.a_;
    base_model.a_ = 1.0 / (right_boundary_value - left_boundary_value);
    base_model.b_ = -1.0 * base_model.a_ * left_boundary_value;
  }

  for (int fanout = 1, fanout_tree_level = 0; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = 0.0;
    double a = base_model.a_ * fanout;
    double b = base_model.b_ * fanout;
    int left_boundary = 0;
    int right_boundary = 0;
    for (int i = 0; i < fanout; i++) {
      left_boundary = right_boundary;
      right_boundary = i == fanout - 1 ? node->data_capacity_
                                       : node->lower_bound(((i + 1) - b) / a);
      if (left_boundary == right_boundary) {
        new_level.push_back({fanout_tree_level, i, 0, left_boundary,
                             right_boundary, false, 0, 0, 0, 0, 0});
        continue;
      }
      int num_actual_keys = 0;
      LinearModel<T> model;
      typename AlexDataNode<T, P>::const_iterator_type it(node, left_boundary);
      LinearModelBuilder<T> builder(&model);
      for (int j = 0; it.cur_idx_ < right_boundary && !it.is_end(); it++, j++) {
        builder.add(it.key(), j);
        num_actual_keys++;
      }
      builder.build();

      double empirical_insert_frac = node->frac_inserts();
      DataNodeStats stats;
      double node_cost =
          AlexDataNode<T, P>::compute_expected_cost_from_existing(
              node, left_boundary, right_boundary,
              AlexDataNode<T, P>::kInitDensity_, empirical_insert_frac, &model,
              &stats);

      cost += node_cost * num_actual_keys / num_keys;

      new_level.push_back({fanout_tree_level, i, node_cost, left_boundary,
                           right_boundary, false, stats.num_search_iterations,
                           stats.num_shifts, model.a_, model.b_,
                           num_actual_keys});
    }
    // model weight reflects that it has global effect, not local effect
    double traversal_cost =
        kNodeLookupsWeight +
        (kModelSizeWeight * fanout *
         (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
    cost += traversal_cost;
    fanout_costs.push_back(cost);
    // stop after expanding fanout increases cost twice in a row
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  merge_nodes_upwards<T, P>(best_level, best_cost, num_keys, total_keys,
                            fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return best_level;
}